

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O0

int SUNMatZero_Dense(SUNMatrix A)

{
  long lVar1;
  realtype *Adata;
  sunindextype i;
  SUNMatrix A_local;
  
  lVar1 = *(long *)((long)A->content + 8);
  for (i = 0; i < *(int *)((long)A->content + 0x10); i = i + 1) {
    *(undefined8 *)(lVar1 + (long)i * 8) = 0;
  }
  return 0;
}

Assistant:

int SUNMatZero_Dense(SUNMatrix A)
{
  sunindextype i;
  realtype *Adata;

  /* Perform operation */
  Adata = SM_DATA_D(A);
  for (i=0; i<SM_LDATA_D(A); i++)
    Adata[i] = ZERO;
  return SUNMAT_SUCCESS;
}